

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

void FT_Vector_Rotate(FT_Vector *vec,FT_Angle angle)

{
  byte bVar1;
  int iVar2;
  FT_Fixed FVar3;
  undefined1 auStack_30 [4];
  FT_Int32 half;
  FT_Vector v;
  FT_Int shift;
  FT_Angle angle_local;
  FT_Vector *vec_local;
  
  if ((vec != (FT_Vector *)0x0) && (angle != 0)) {
    _auStack_30 = vec->x;
    v.x = vec->y;
    if ((_auStack_30 != 0) || (v.x != 0)) {
      v.y._4_4_ = ft_trig_prenorm((FT_Vector *)auStack_30);
      ft_trig_pseudo_rotate((FT_Vector *)auStack_30,angle);
      _auStack_30 = ft_trig_downscale(_auStack_30);
      FVar3 = ft_trig_downscale(v.x);
      bVar1 = (byte)v.y._4_4_;
      if (v.y._4_4_ < 1) {
        vec->x = _auStack_30 << (-bVar1 & 0x3f);
        vec->y = FVar3 << (-bVar1 & 0x3f);
      }
      else {
        iVar2 = 1 << (bVar1 - 1 & 0x1f);
        vec->x = (_auStack_30 + iVar2) - (long)(int)(uint)(_auStack_30 < 0) >> (bVar1 & 0x3f);
        vec->y = (FVar3 + iVar2) - (long)(int)(uint)(FVar3 < 0) >> (bVar1 & 0x3f);
      }
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Rotate( FT_Vector*  vec,
                    FT_Angle    angle )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec || !angle )
      return;

    v = *vec;

    if ( v.x == 0 && v.y == 0 )
      return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_rotate( &v, angle );
    v.x = ft_trig_downscale( v.x );
    v.y = ft_trig_downscale( v.y );

    if ( shift > 0 )
    {
      FT_Int32  half = (FT_Int32)1L << ( shift - 1 );


      vec->x = ( v.x + half - ( v.x < 0 ) ) >> shift;
      vec->y = ( v.y + half - ( v.y < 0 ) ) >> shift;
    }
    else
    {
      shift  = -shift;
      vec->x = (FT_Pos)( (FT_ULong)v.x << shift );
      vec->y = (FT_Pos)( (FT_ULong)v.y << shift );
    }
  }